

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::objectivec::FileClassPrefix_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FileDescriptor *file)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,*(string **)(*(long *)(this + 0xa0) + 0x80));
  return __return_storage_ptr__;
}

Assistant:

string FileClassPrefix(const FileDescriptor* file) {
  // Default is empty string, no need to check has_objc_class_prefix.
  string result = file->options().objc_class_prefix();
  return result;
}